

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O3

int __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
Connection::close(Connection *this,int __fd)

{
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *psVar1;
  error_code eVar2;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  psVar1 = (this->socket)._M_t.
           super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
           .
           super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
           ._M_head_impl;
  asio::detail::reactive_socket_service<asio::ip::tcp>::shutdown
            (*(reactive_socket_service<asio::ip::tcp> **)
              &(psVar1->next_layer_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,
             (int)psVar1 + 8,2);
  eVar2 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::cancel
                    ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)
                     (this->socket)._M_t.
                     super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
                     .
                     super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
                     ._M_head_impl,&local_20);
  return eVar2._M_value;
}

Assistant:

void close() noexcept {
        error_code ec;
        socket->lowest_layer().shutdown(asio::ip::tcp::socket::shutdown_both, ec);
        socket->lowest_layer().cancel(ec);
      }